

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Result __thiscall wabt::anon_unknown_4::Validator::OnCallRefExpr(Validator *this,CallRefExpr *expr)

{
  Location *loc;
  bool bVar1;
  Result RVar2;
  bool bVar3;
  Index function_type_index;
  Index local_64;
  Var local_60;
  
  loc = &(expr->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc;
  RVar2 = SharedValidator::OnCallRef(&this->validator_,loc,&local_64);
  bVar3 = (this->result_).enum_ == Error;
  bVar1 = RVar2.enum_ == Error || bVar3;
  (this->result_).enum_ = (uint)bVar1;
  if (RVar2.enum_ != Error && !bVar3) {
    Var::Var(&local_60,local_64,loc);
    Var::operator=(&expr->function_type_index,&local_60);
    Var::~Var(&local_60);
  }
  return (Result)(uint)bVar1;
}

Assistant:

Result Validator::OnCallRefExpr(CallRefExpr* expr) {
  Index function_type_index;
  result_ |= validator_.OnCallRef(expr->loc, &function_type_index);
  if (Succeeded(result_)) {
    expr->function_type_index = Var{function_type_index, expr->loc};
    return Result::Ok;
  }

  return Result::Error;
}